

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_cubic_interpolation.cpp
# Opt level: O2

int main(void)

{
  void *pvVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Mat *pMVar6;
  double local_178;
  _InputArray local_170;
  PointType p;
  _InputArray local_130;
  double t;
  double local_110;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> vec;
  Mat img;
  CubicInterpolation cubic;
  
  CubicInterpolation::CubicInterpolation(&cubic);
  _img = 0x4059000000000000;
  p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = 300.0;
  p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 300.0;
  CubicInterpolation::interpolation(&cubic,(PointType *)&img,0.0,&p,0.0);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&p,0.0);
  cv::Mat::Mat(&img,400,400,0x10,(Scalar_ *)&p);
  vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (t = 0.0; t <= 1.0; t = t + 0.01) {
    local_170.flags = 0;
    CubicInterpolation::at((CubicInterpolation *)&p,(double *)&cubic,(int *)&t);
    local_170.flags =
         (int)p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
              [0];
    local_130.flags =
         (int)p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
              [1];
    std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<int,int>
              ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&vec,&local_170.flags,
               &local_130.flags);
  }
  local_170.sz.width = 0;
  local_170.sz.height = 0;
  local_130.sz.width = 0;
  local_130.sz.height = 0;
  local_170.flags = 0x3010000;
  local_170.obj = &img;
  local_130.flags = -0x7efcfff4;
  local_130.obj = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&vec;
  cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&p);
  p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = 0.0;
  p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 0.0;
  cv::polylines((_InputOutputArray *)&local_170,&local_130,false,(Scalar_ *)&p,1,0x10,0);
  local_178 = 0.0;
  for (uVar3 = 1;
      uVar3 < (ulong)((long)vec.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)vec.
                            super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    iVar4 = vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3].x -
            vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3 - 1].x;
    iVar5 = vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3].y -
            vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3 - 1].y;
    local_178 = local_178 + SQRT((double)(iVar5 * iVar5 + iVar4 * iVar4));
  }
  std::operator<<((ostream *)&std::cout,"naive length: ");
  poVar2 = std::ostream::_M_insert<double>(local_178);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"length: ");
  poVar2 = std::ostream::_M_insert<double>(cubic.super_Curve<3,_2>.length_);
  std::endl<char,std::char_traits<char>>(poVar2);
  p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = 20.0;
  local_130.flags = 4;
  Curve<3,_2>::sampleWithArcLengthParameterized
            ((vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
              *)&local_170,&cubic.super_Curve<3,_2>,(double *)&p,true,&local_130.flags,
             (vector<double,_std::allocator<double>_> *)0x0);
  pvVar1 = local_170.obj;
  for (pMVar6 = (Mat *)CONCAT44(local_170._4_4_,local_170.flags); pMVar6 != (Mat *)pvVar1;
      pMVar6 = pMVar6 + 0x10) {
    local_130.sz.width = 0;
    local_130.sz.height = 0;
    local_130.flags = 0x3010000;
    local_130.obj = &img;
    local_110 = (double)CONCAT44((int)*(double *)(pMVar6 + 8),(int)*(double *)pMVar6);
    cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&p);
    p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = 255.0
    ;
    p.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] = 255.0
    ;
    cv::circle(&local_130,&local_110,4,(Matx<double,_4,_1> *)&p,1,8,0);
  }
  std::
  _Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
                   *)&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,"Cubic Interpolation",(allocator<char> *)&local_130);
  local_170.sz.width = 0;
  local_170.sz.height = 0;
  local_170.flags = 0x1010000;
  local_170.obj = &img;
  cv::imshow((string *)&p,&local_170);
  std::__cxx11::string::~string((string *)&p);
  cv::waitKey(0);
  std::_Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~_Vector_base
            (&vec.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>);
  cv::Mat::~Mat(&img);
  return 0;
}

Assistant:

int main() {
  // fit a cubic spline
  CubicInterpolation cubic;
  cubic.interpolation({100, 100}, 0, {300, 300}, 0);

  int width = 400;
  Mat img(width, width, CV_8UC3, Scalar(0));

  vector<Point> vec;
  double t = 0.0, step = 0.01;
  while (t <= 1.0) {
    auto p = cubic.at(t);
    vec.emplace_back(int(p[0]), int(p[1]));
    t += step;
  }
  polylines(img, vec, false, {0, 0, 255}, 1, LINE_AA);
  double acc_length = 0;
  for (int i = 1; i < vec.size(); ++i) {
    auto p = (vec[i] - vec[i - 1]);
    acc_length += sqrt(p.x * p.x + p.y * p.y);
  }
  cout << "naive length: " << acc_length << endl;
  cout << "length: " << cubic.length() << endl;

  // Uniform sampling
  for (auto p : cubic.sampleWithArcLengthParameterized(20)) {
    cv::circle(img, {int(p.x()), int(p.y())}, 4, {255, 255, 255}, 1);
  }

  imshow("Cubic Interpolation", img);
  waitKey(0);

  return 0;
}